

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::RandomBufferWriteCase::iterate(RandomBufferWriteCase *this)

{
  size_type *psVar1;
  GLenum usage;
  int iVar2;
  TestLog *this_00;
  deUint8 *ptr;
  pointer pVVar3;
  void *pvVar4;
  vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *pvVar5;
  char cVar6;
  uint uVar7;
  deUint32 dVar8;
  int iVar9;
  undefined8 *puVar10;
  long *plVar11;
  TestError *this_01;
  int iVar12;
  ulong *puVar13;
  pointer puVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  size_t in_R9;
  uint uVar18;
  CallLogWrapper *this_02;
  long offset;
  pointer pVVar19;
  int numBytes;
  bool bVar20;
  float fVar21;
  Random rnd;
  string local_338;
  long *local_318;
  undefined8 local_310;
  long local_308;
  undefined8 uStack_300;
  string local_2f8;
  ReferenceBuffer *local_2d8;
  vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *local_2d0;
  ulong local_2c8;
  ulong *local_2c0;
  long local_2b8;
  ulong local_2b0;
  long lStack_2a8;
  code *local_2a0;
  GLenum local_298;
  undefined4 uStack_294;
  ulong local_290 [2];
  ulong *local_280;
  long local_278;
  ulong local_270 [2];
  ulong *local_260;
  long local_258;
  ulong local_250 [2];
  ulong *local_240;
  long local_238;
  ulong local_230 [2];
  ulong *local_220;
  long local_218;
  ulong local_210 [2];
  deRandom local_200;
  LogSection local_1f0;
  CallLogWrapper *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  uVar7 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar7 = (uVar7 >> 4 ^ uVar7) * 0x27d4eb2d;
  deRandom_init(&local_200,uVar7 >> 0xf ^ this->m_seed ^ uVar7 ^ 0xacf92e);
  this_00 = ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  local_2a0 = (code *)local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Iteration","");
  iVar15 = this->m_iterNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,iVar15 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar17 = local_218 + CONCAT44(uStack_294,local_298);
  uVar16 = 0xf;
  if (local_2a0 != (code *)local_290) {
    uVar16 = local_290[0];
  }
  if (uVar16 < uVar17) {
    uVar16 = 0xf;
    if (local_220 != local_210) {
      uVar16 = local_210[0];
    }
    if (uVar16 < uVar17) goto LAB_00fa4265;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_220,0,(char *)0x0,(ulong)local_2a0);
  }
  else {
LAB_00fa4265:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_220);
  }
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  psVar1 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_338.field_2._M_allocated_capacity = *psVar1;
    local_338.field_2._8_4_ = *(undefined4 *)(puVar10 + 3);
    local_338.field_2._12_4_ = *(undefined4 *)((long)puVar10 + 0x1c);
  }
  else {
    local_338.field_2._M_allocated_capacity = *psVar1;
    local_338._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_338._M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Iteration ","");
  iVar15 = this->m_iterNdx;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,iVar15 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar17 = 0xf;
  if (local_240 != local_230) {
    uVar17 = local_230[0];
  }
  if (uVar17 < (ulong)(local_258 + local_238)) {
    uVar17 = 0xf;
    if (local_260 != local_250) {
      uVar17 = local_250[0];
    }
    if (uVar17 < (ulong)(local_258 + local_238)) goto LAB_00fa43ae;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_260,0,(char *)0x0,(ulong)local_240);
  }
  else {
LAB_00fa43ae:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_260);
  }
  local_318 = &local_308;
  plVar11 = puVar10 + 2;
  if ((long *)*puVar10 == plVar11) {
    local_308 = *plVar11;
    uStack_300 = puVar10[3];
  }
  else {
    local_308 = *plVar11;
    local_318 = (long *)*puVar10;
  }
  local_310 = puVar10[1];
  *puVar10 = plVar11;
  puVar10[1] = 0;
  *(undefined1 *)plVar11 = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_318);
  puVar13 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar13) {
    local_2b0 = *puVar13;
    lStack_2a8 = plVar11[3];
    local_2c0 = &local_2b0;
  }
  else {
    local_2b0 = *puVar13;
    local_2c0 = (ulong *)*plVar11;
  }
  local_2b8 = plVar11[1];
  *plVar11 = (long)puVar13;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar17 = 0xf;
  if (local_2c0 != &local_2b0) {
    uVar17 = local_2b0;
  }
  if (uVar17 < (ulong)(local_278 + local_2b8)) {
    uVar17 = 0xf;
    if (local_280 != local_270) {
      uVar17 = local_270[0];
    }
    if ((ulong)(local_278 + local_2b8) <= uVar17) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_2c0);
      goto LAB_00fa4551;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_280);
LAB_00fa4551:
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  psVar1 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_2f8.field_2._M_allocated_capacity = *psVar1;
    local_2f8.field_2._8_8_ = puVar10[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar1;
    local_2f8._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_2f8._M_string_length = puVar10[1];
  *puVar10 = psVar1;
  puVar10[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::LogSection::LogSection(&local_1f0,&local_338,&local_2f8);
  tcu::TestLog::startSection
            (this_00,local_1f0.m_name._M_dataplus._M_p,local_1f0.m_description._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_description._M_dataplus._M_p != &local_1f0.m_description.field_2) {
    operator_delete(local_1f0.m_description._M_dataplus._M_p,
                    local_1f0.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_name._M_dataplus._M_p != &local_1f0.m_name.field_2) {
    operator_delete(local_1f0.m_name._M_dataplus._M_p,
                    local_1f0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if (local_280 != local_270) {
    operator_delete(local_280,local_270[0] + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if (local_260 != local_250) {
    operator_delete(local_260,local_250[0] + 1);
  }
  if (local_240 != local_230) {
    operator_delete(local_240,local_230[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  if (local_2a0 != (code *)local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  this_02 = &(this->super_BufferCase).super_CallLogWrapper;
  local_2d0 = (vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>> *)&this->m_validRanges;
  local_2d8 = &this->m_refBuffer;
  local_2c8 = 0;
  iVar15 = 7;
  local_1b0 = this_02;
  do {
    dVar8 = deRandom_getUint32(&local_200);
    uVar7 = iterate::bufferTargets[dVar8 & 1];
    if (this->m_curSize == 0) {
      bVar20 = true;
    }
    else {
      fVar21 = deRandom_getFloat(&local_200);
      bVar20 = fVar21 < 0.07;
    }
    if (uVar7 != (uint)local_2c8) {
      glu::CallLogWrapper::glBindBuffer(this_02,uVar7,this->m_buffer);
      local_2c8 = (ulong)uVar7;
    }
    if (bVar20) {
      dVar8 = deRandom_getUint32(&local_200);
      uVar18 = dVar8 % 0x7ff5 + 0xc;
      dVar8 = deRandom_getUint32(&local_200);
      usage = iterate::usageHints[dVar8 % 3];
      fVar21 = deRandom_getFloat(&local_200);
      BufferTestUtil::ReferenceBuffer::setSize(local_2d8,uVar18);
      if (fVar21 < 0.2) {
        ptr = (local_2d8->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
        dVar8 = deRandom_getUint32(&local_200);
        BufferTestUtil::fillWithRandomBytes(ptr,uVar18,dVar8);
        puVar14 = (this->m_refBuffer).m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      else {
        puVar14 = (pointer)0x0;
      }
      glu::CallLogWrapper::glBufferData(this_02,uVar7,(ulong)uVar18,puVar14,usage);
      pVVar3 = (this->m_validRanges).
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_validRanges).
          super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
          super__Vector_impl_data._M_finish != pVVar3) {
        (this->m_validRanges).
        super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
        super__Vector_impl_data._M_finish = pVVar3;
      }
      if (fVar21 < 0.2) {
        local_1a8[0]._M_dataplus._M_p._0_4_ = 0;
        local_1a8[0]._M_dataplus._M_p._4_4_ = uVar18;
        std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>::
        emplace_back<tcu::Vector<int,2>>(local_2d0,(Vector<int,_2> *)local_1a8);
      }
      this->m_curSize = uVar18;
    }
    else {
      iVar2 = this->m_curSize;
      fVar21 = deRandom_getFloat(&local_200);
      fVar21 = powf(fVar21 * 0.7 + 0.0,3.0);
      fVar21 = fVar21 * (float)iVar2;
      iVar9 = (int)(fVar21 + *(float *)(&DAT_01bc5724 + (ulong)(fVar21 < 0.0) * 4));
      iVar2 = this->m_curSize;
      iVar12 = iVar9;
      if (iVar2 <= iVar9) {
        iVar12 = iVar2;
      }
      numBytes = 0xc;
      if (0xb < iVar9) {
        numBytes = iVar12;
      }
      dVar8 = deRandom_getUint32(&local_200);
      uVar18 = dVar8 % ((iVar2 - numBytes) + 1U);
      offset = (long)(int)uVar18;
      puVar14 = (this->m_refBuffer).m_data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar8 = deRandom_getUint32(&local_200);
      BufferTestUtil::fillWithRandomBytes(puVar14 + offset,numBytes,dVar8);
      this_02 = local_1b0;
      glu::CallLogWrapper::glBufferSubData
                (local_1b0,uVar7,offset,(long)numBytes,
                 (this->m_refBuffer).m_data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + offset);
      pvVar5 = local_2d0;
      local_1f0.m_name._M_dataplus._M_p._4_4_ = numBytes;
      local_1f0.m_name._M_dataplus._M_p._0_4_ = uVar18;
      addRangeToList((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_1a8
                     ,(vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                      local_2d0,(IVec2 *)&local_1f0);
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::_M_move_assign
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)pvVar5,
                 local_1a8);
      pvVar4 = (void *)CONCAT44(local_1a8[0]._M_dataplus._M_p._4_4_,
                                local_1a8[0]._M_dataplus._M_p._0_4_);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,local_1a8[0].field_2._M_allocated_capacity - (long)pvVar4);
      }
    }
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  local_298 = glu::CallLogWrapper::glGetError(this_02);
  if (local_298 != 0) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    local_1f0.m_name._M_dataplus._M_p = (pointer)&local_1f0.m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Got ","");
    local_2a0 = glu::getErrorName;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_338,&local_2a0);
    std::operator+(local_1a8,&local_1f0.m_name,&local_338);
    tcu::TestError::TestError(this_01,local_1a8);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pVVar3 = (this->m_validRanges).
           super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar20 = pVVar3 == (this->m_validRanges).
                     super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
  if (!bVar20) {
    iVar15 = BufferTestUtil::BufferVerifier::verify
                       (this->m_verifier,(EVP_PKEY_CTX *)(ulong)this->m_buffer,
                        (this->m_refBuffer).m_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,(ulong)(uint)pVVar3->m_data[0],
                        (uchar *)(ulong)(uint)pVVar3->m_data[1],in_R9);
    cVar6 = (char)iVar15;
    while (cVar6 != '\0') {
      pVVar19 = pVVar3 + 1;
      bVar20 = pVVar19 ==
               (this->m_validRanges).
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (bVar20) goto LAB_00fa4acf;
      iVar15 = BufferTestUtil::BufferVerifier::verify
                         (this->m_verifier,(EVP_PKEY_CTX *)(ulong)this->m_buffer,
                          (this->m_refBuffer).m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,(ulong)(uint)pVVar19->m_data[0],
                          (uchar *)(ulong)(uint)pVVar3[1].m_data[1],in_R9);
      pVVar3 = pVVar19;
      cVar6 = (char)iVar15;
    }
    tcu::TestContext::setTestResult
              ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Buffer verification failed");
  }
LAB_00fa4acf:
  tcu::TestLog::endSection
            (((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  iVar15 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar15;
  return (IterateResult)(byte)(iVar15 < 5 & bVar20);
}

Assistant:

IterateResult iterate (void)
	{
		// Parameters.
		const int	numIterations				= 5;
		const int	uploadsPerIteration			= 7;
		const int	minSize						= 12;
		const int	maxSize						= 32*1024;
		const float	respecifyProbability		= 0.07f;
		const float	respecifyDataProbability	= 0.2f;

		static const deUint32 bufferTargets[] =
		{
			GL_ARRAY_BUFFER,
			GL_ELEMENT_ARRAY_BUFFER
		};

		static const deUint32 usageHints[] =
		{
			GL_STREAM_DRAW,
			GL_STATIC_DRAW,
			GL_DYNAMIC_DRAW,
		};

		bool		iterOk					= true;
		deUint32	curBoundTarget			= GL_NONE;
		de::Random	rnd						(m_seed ^ deInt32Hash(m_iterNdx) ^ 0xacf92e);

		m_testCtx.getLog() << TestLog::Section(string("Iteration") + de::toString(m_iterNdx+1), string("Iteration ") + de::toString(m_iterNdx+1) + " / " + de::toString(numIterations));

		for (int uploadNdx = 0; uploadNdx < uploadsPerIteration; uploadNdx++)
		{
			const deUint32	target		= bufferTargets[rnd.getInt(0, DE_LENGTH_OF_ARRAY(bufferTargets)-1)];
			const bool		respecify	= m_curSize == 0 || rnd.getFloat() < respecifyProbability;

			if (target != curBoundTarget)
			{
				glBindBuffer(target, m_buffer);
				curBoundTarget = target;
			}

			if (respecify)
			{
				const int		size			= rnd.getInt(minSize, maxSize);
				const deUint32	hint			= usageHints[rnd.getInt(0, DE_LENGTH_OF_ARRAY(usageHints)-1)];
				const bool		fillWithData	= rnd.getFloat() < respecifyDataProbability;

				m_refBuffer.setSize(size);
				if (fillWithData)
					fillWithRandomBytes(m_refBuffer.getPtr(), size, rnd.getUint32());

				glBufferData(target, size, fillWithData ? m_refBuffer.getPtr() : DE_NULL, hint);

				m_validRanges.clear();
				if (fillWithData)
					m_validRanges.push_back(tcu::IVec2(0, size));

				m_curSize = size;
			}
			else
			{
				// \note Non-uniform size distribution.
				const int	size	= de::clamp(deRoundFloatToInt32((float)m_curSize * deFloatPow(rnd.getFloat(0.0f, 0.7f), 3.0f)), minSize, m_curSize);
				const int	offset	= rnd.getInt(0, m_curSize-size);

				fillWithRandomBytes(m_refBuffer.getPtr()+offset, size, rnd.getUint32());
				glBufferSubData(target, offset, size, m_refBuffer.getPtr()+offset);

				m_validRanges = addRangeToList(m_validRanges, tcu::IVec2(offset, size));
			}
		}

		// Check error.
		{
			deUint32 err = glGetError();
			if (err != GL_NO_ERROR)
				throw tcu::TestError(string("Got ") + glu::getErrorStr(err).toString());
		}

		// Verify valid ranges.
		for (vector<IVec2>::const_iterator range = m_validRanges.begin(); range != m_validRanges.end(); range++)
		{
			if (!m_verifier->verify(m_buffer, m_refBuffer.getPtr(), range->x(), range->y()))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer verification failed");
				iterOk = false;
				break;
			}
		}

		m_testCtx.getLog() << TestLog::EndSection;

		DE_ASSERT(iterOk || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS);

		m_iterNdx += 1;
		return (iterOk && m_iterNdx < numIterations) ? CONTINUE : STOP;
	}